

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a2934::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile
          (JobEvalCacheUicT *this,SourceFileHandleT *sourceFileHandle)

{
  anon_class_32_4_dfb3bdf1 __pred;
  bool bVar1;
  element_type *this_00;
  element_type *peVar2;
  const_iterator __first;
  const_iterator __last;
  char *in_RCX;
  string_view filename;
  undefined1 auVar3 [16];
  undefined1 local_50 [8];
  string sourceDirPrefix;
  vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
  *Include;
  SourceFileT *sourceFile;
  SourceFileHandleT *sourceFileHandle_local;
  JobEvalCacheUicT *this_local;
  
  this_00 = std::
            __shared_ptr_access<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)sourceFileHandle);
  peVar2 = std::
           __shared_ptr_access<(anonymous_namespace)::cmQtAutoMocUicT::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<(anonymous_namespace)::cmQtAutoMocUicT::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this_00->ParseData);
  sourceDirPrefix.field_2._8_8_ = &peVar2->Uic;
  if (((this_00->Uic & 1U) != 0) &&
     (bVar1 = std::
              vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
              ::empty((vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
                       *)sourceDirPrefix.field_2._8_8_), !bVar1)) {
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    filename._M_len = auVar3._8_8_;
    filename._M_str = in_RCX;
    cmQtAutoGen::SubDirPrefix_abi_cxx11_((string *)local_50,auVar3._0_8_,filename);
    __first = std::
              vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
              ::begin((vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
                       *)sourceDirPrefix.field_2._8_8_);
    __last = std::
             vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
             ::end((vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
                    *)sourceDirPrefix.field_2._8_8_);
    __pred.sourceDirPrefix = (string *)local_50;
    __pred.this = this;
    __pred.sourceFile = this_00;
    __pred.sourceFileHandle = sourceFileHandle;
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT_const*,std::vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>>>,(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                      ((__normal_iterator<const_(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT_*,_std::vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT_*,_std::vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>_>
                        )__last._M_current,__pred);
    std::__cxx11::string::~string((string *)local_50);
    return bVar1;
  }
  return true;
}

Assistant:

bool cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(
  SourceFileHandleT const& sourceFileHandle)
{
  SourceFileT const& sourceFile = *sourceFileHandle;
  auto const& Include = sourceFile.ParseData->Uic.Include;
  if (!sourceFile.Uic || Include.empty()) {
    return true;
  }

  std::string const sourceDirPrefix = SubDirPrefix(sourceFile.FileName);
  return std::all_of(
    Include.begin(), Include.end(),
    [this, &sourceDirPrefix, &sourceFile,
     &sourceFileHandle](IncludeKeyT const& incKey) -> bool {
      // Find .ui file
      this->UiName = cmStrCat(incKey.Base, ".ui");
      if (!this->FindIncludedUi(sourceDirPrefix, incKey.Dir)) {
        this->LogError(
          GenT::UIC,
          cmStrCat(this->MessagePath(sourceFile.FileName),
                   "\nincludes the uic file ", this->MessagePath(incKey.Key),
                   ",\nbut the user interface file ",
                   this->MessagePath(this->UiName),
                   "\ncould not be found in the following directories\n",
                   this->MessageSearchLocations()));
        return false;
      }
      // Check if the file is skipped
      if (this->UicConst().skipped(this->UiFileHandle->FileName)) {
        return true;
      }
      // Register mapping
      return this->RegisterMapping(incKey.Key, sourceFileHandle);
    });
}